

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::CheckTweakedSchnorrPubkeyRequest::ConvertFromStruct
          (CheckTweakedSchnorrPubkeyRequest *this,CheckTweakedSchnorrPubkeyRequestStruct *data)

{
  CheckTweakedSchnorrPubkeyRequestStruct *data_local;
  CheckTweakedSchnorrPubkeyRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->pubkey_,(string *)data);
  this->parity_ = (bool)(data->parity & 1);
  std::__cxx11::string::operator=((string *)&this->base_pubkey_,(string *)&data->base_pubkey);
  std::__cxx11::string::operator=((string *)&this->tweak_,(string *)&data->tweak);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void CheckTweakedSchnorrPubkeyRequest::ConvertFromStruct(
    const CheckTweakedSchnorrPubkeyRequestStruct& data) {
  pubkey_ = data.pubkey;
  parity_ = data.parity;
  base_pubkey_ = data.base_pubkey;
  tweak_ = data.tweak;
  ignore_items = data.ignore_items;
}